

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dp.c
# Opt level: O0

DPlist AddDPPossibility(CP_Services Svcs,void *CP_Stream,DPlist List,CP_DP_Interface Interface,
                       char *Name,_SstParams *Params)

{
  int iVar1;
  CP_DP_Interface in_RCX;
  DPlist in_RDX;
  void *in_RSI;
  CP_Services in_RDI;
  char *in_R8;
  _SstParams *in_R9;
  int Count;
  int local_3c;
  DPlist local_20;
  DPlist local_8;
  
  local_3c = 0;
  local_8 = in_RDX;
  if (in_RCX != (CP_DP_Interface)0x0) {
    if (in_RDX == (DPlist)0x0) {
      local_20 = (DPlist)malloc(0x30);
    }
    else {
      while (in_RDX[local_3c].Interface != (CP_DP_Interface)0x0) {
        local_3c = local_3c + 1;
      }
      local_20 = (DPlist)realloc(in_RDX,(long)(local_3c + 2) * 0x18);
    }
    local_20[local_3c].Interface = in_RCX;
    local_20[local_3c].Name = in_R8;
    iVar1 = (*in_RCX->getPriority)(in_RDI,in_RSI,in_R9);
    local_20[local_3c].Priority = (long)iVar1;
    local_20[local_3c + 1].Interface = (CP_DP_Interface)0x0;
    local_8 = local_20;
  }
  return local_8;
}

Assistant:

static DPlist AddDPPossibility(CP_Services Svcs, void *CP_Stream, DPlist List,
                               CP_DP_Interface Interface, const char *Name,
                               struct _SstParams *Params)
{
    int Count = 0;
    if (Interface == NULL)
        return List;
    if (List == NULL)
    {
        List = malloc(2 * sizeof(*List));
    }
    else
    {
        while (List[Count].Interface)
        {
            Count++;
        }
        List = realloc(List, sizeof(*List) * (Count + 2));
    }
    List[Count].Interface = Interface;
    List[Count].Name = Name;
    List[Count].Priority = Interface->getPriority(Svcs, CP_Stream, Params);
    List[Count + 1].Interface = NULL;
    return List;
}